

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O3

s32 __thiscall irr::gui::CGUIEditBox::getCursorPos(CGUIEditBox *this,s32 x,s32 y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  int iVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  
  plVar5 = (long *)(**(code **)(*(long *)this + 0x130))();
  if (((this->WordWrap == false) && (iVar6 = 1, this->MultiLine != true)) ||
     (iVar6 = (int)((ulong)((long)(this->BrokenText).m_data.
                                  super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->BrokenText).m_data.
                                 super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5), iVar6 != 0)) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      iVar2 = (int)lVar7;
      setTextRect(this,iVar2);
      iVar4 = (this->CurrentTextRect).UpperLeftCorner.Y;
      iVar3 = iVar4;
      if (iVar4 < y) {
        iVar3 = y;
      }
      iVar1 = (this->CurrentTextRect).LowerRightCorner.Y;
      if (iVar2 != 0) {
        iVar3 = y;
      }
      y = iVar1;
      if (iVar3 < iVar1) {
        y = iVar3;
      }
      if (iVar2 - iVar6 != -1) {
        y = iVar3;
      }
      if (y <= iVar1 && iVar4 <= y) {
        if (this->WordWrap == true) {
          puVar8 = (undefined8 *)
                   ((long)(this->BrokenText).m_data.
                          super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - lVar9);
        }
        else {
          if (this->MultiLine != true) {
            puVar8 = (undefined8 *)&this->field_0xa8;
            iVar6 = 0;
            goto LAB_0021639c;
          }
          puVar8 = (undefined8 *)
                   ((long)(this->BrokenText).m_data.
                          super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - lVar9);
        }
        iVar6 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar7];
LAB_0021639c:
        if (puVar8 == (undefined8 *)0x0) {
          return 0;
        }
        iVar4 = (this->CurrentTextRect).UpperLeftCorner.X;
        iVar2 = x + 3;
        if (x + 3 <= iVar4) {
          iVar2 = iVar4;
        }
        iVar4 = (**(code **)(*plVar5 + 0x10))(plVar5,*puVar8,iVar2 - iVar4);
        if (iVar4 == -1) {
          iVar4 = *(int *)(puVar8 + 1);
        }
        return iVar4 + iVar6;
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + -0x20;
    } while ((int)lVar7 != iVar6);
  }
  return 0;
}

Assistant:

s32 CGUIEditBox::getCursorPos(s32 x, s32 y)
{
	IGUIFont *font = getActiveFont();

	const u32 lineCount = (WordWrap || MultiLine) ? BrokenText.size() : 1;

	core::stringw *txtLine = 0;
	s32 startPos = 0;
	x += 3;

	for (u32 i = 0; i < lineCount; ++i) {
		setTextRect(i);
		if (i == 0 && y < CurrentTextRect.UpperLeftCorner.Y)
			y = CurrentTextRect.UpperLeftCorner.Y;
		if (i == lineCount - 1 && y > CurrentTextRect.LowerRightCorner.Y)
			y = CurrentTextRect.LowerRightCorner.Y;

		// is it inside this region?
		if (y >= CurrentTextRect.UpperLeftCorner.Y && y <= CurrentTextRect.LowerRightCorner.Y) {
			// we've found the clicked line
			txtLine = (WordWrap || MultiLine) ? &BrokenText[i] : &Text;
			startPos = (WordWrap || MultiLine) ? BrokenTextPositions[i] : 0;
			break;
		}
	}

	if (x < CurrentTextRect.UpperLeftCorner.X)
		x = CurrentTextRect.UpperLeftCorner.X;

	if (!txtLine)
		return 0;

	s32 idx = font->getCharacterFromPos(txtLine->c_str(), x - CurrentTextRect.UpperLeftCorner.X);

	// click was on or left of the line
	if (idx != -1)
		return idx + startPos;

	// click was off the right edge of the line, go to end.
	return txtLine->size() + startPos;
}